

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkServerTest.cpp
# Opt level: O2

void __thiscall
MyServer::OnAdvertisement
          (MyServer *this,string *ipString,uint16_t port,uint8_t *data,uint32_t bytes)

{
  OutputWorker *pOVar1;
  uint8_t pong [5];
  undefined3 uStack_1ab;
  ostringstream local_1a0 [376];
  
  if (bytes == 5) {
    if (*data == 'e') {
      if (2 < (int)Logger.ChannelMinLevel) {
        return;
      }
      _pong = Logger.ChannelName;
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      std::operator<<((ostream *)local_1a0,(string *)&Logger.Prefix);
      std::operator<<((ostream *)local_1a0,"Advertisement PONG received from ");
      std::operator<<((ostream *)local_1a0,(string *)ipString);
      std::operator<<((ostream *)local_1a0,":");
      std::ostream::operator<<((ostream *)local_1a0,port);
      std::operator<<((ostream *)local_1a0," - ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      std::operator<<((ostream *)local_1a0," bytes");
      pOVar1 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar1,(LogStringBuffer *)pong);
      goto LAB_001048d0;
    }
    if (*data == 'd') {
      if ((int)Logger.ChannelMinLevel < 3) {
        _pong = Logger.ChannelName;
        std::__cxx11::ostringstream::ostringstream(local_1a0);
        std::operator<<((ostream *)local_1a0,(string *)&Logger.Prefix);
        std::operator<<((ostream *)local_1a0,"Advertisement PING received from ");
        std::operator<<((ostream *)local_1a0,(string *)ipString);
        std::operator<<((ostream *)local_1a0,":");
        std::ostream::operator<<((ostream *)local_1a0,port);
        std::operator<<((ostream *)local_1a0," - ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
        std::operator<<((ostream *)local_1a0," bytes");
        pOVar1 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar1,(LogStringBuffer *)pong);
        std::__cxx11::ostringstream::~ostringstream(local_1a0);
      }
      _pong = (char *)CONCAT35(uStack_1ab,0x400000000);
      _pong = (char *)CONCAT44(stack0xfffffffffffffe54,0x3020165);
      tonk::SDKSocket::Advertise(&this->super_SDKSocket,ipString,port,pong,5);
      return;
    }
  }
  if (4 < (int)Logger.ChannelMinLevel) {
    return;
  }
  _pong = Logger.ChannelName;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,(string *)&Logger.Prefix);
  std::operator<<((ostream *)local_1a0,"Unknown advertisement received from ");
  std::operator<<((ostream *)local_1a0,(string *)ipString);
  std::operator<<((ostream *)local_1a0,":");
  std::ostream::operator<<((ostream *)local_1a0,port);
  std::operator<<((ostream *)local_1a0," - ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::operator<<((ostream *)local_1a0," bytes");
  pOVar1 = logger::OutputWorker::GetInstance();
  logger::OutputWorker::Write(pOVar1,(LogStringBuffer *)pong);
LAB_001048d0:
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

void MyServer::OnAdvertisement(
    const std::string& ipString, ///< Source IP address of advertisement
    uint16_t               port, ///< Source port address of advertisement
    const uint8_t*         data,  ///< Pointer to a buffer containing the message data
    uint32_t              bytes)  ///< Number of bytes in the message
{
    if (bytes == test::kPongBytes)
    {
        if (data[0] == test::ID_Advertise_Ping)
        {
            Logger.Info("Advertisement PING received from ", ipString, ":", port, " - ", bytes, " bytes");

            uint8_t pong[test::kPongBytes] = {
                test::ID_Advertise_Pong, 1, 2, 3, 4
            };
            Advertise(ipString, port, pong, test::kPongBytes);
            return;
        }
        if (data[0] == test::ID_Advertise_Pong)
        {
            Logger.Info("Advertisement PONG received from ", ipString, ":", port, " - ", bytes, " bytes");
            return;
        }
    }

    Logger.Error("Unknown advertisement received from ", ipString, ":", port, " - ", bytes, " bytes");
}